

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O3

void ga_iscal_patch_(Integer *g_a,Integer *ilo,Integer *ihi,Integer *jlo,Integer *jhi,Integer *alpha
                    )

{
  Integer atype;
  Integer lo [2];
  Integer local_60;
  Integer local_58;
  Integer local_50;
  Integer local_48;
  Integer local_40;
  
  pnga_inquire_type(*g_a,&local_60);
  pnga_error(" wrong types ",0);
  local_48 = *ilo;
  local_58 = *ihi;
  local_40 = *jlo;
  local_50 = *jhi;
  pnga_scale_patch(*g_a,&local_48,&local_58,alpha);
  return;
}

Assistant:

void FATR ga_iscal_patch_(Integer *g_a, Integer *ilo, Integer *ihi, Integer *jlo, Integer *jhi, Integer *alpha)
{
    Integer atype;

    pnga_inquire_type(*g_a, &atype);
    if (atype != C_INT || atype != C_LONG || atype != C_LONGLONG)
        pnga_error(" wrong types ", 0L);
    sga_scale_patch(*g_a, ilo, ihi, jlo, jhi, alpha);
}